

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

bool simdTestMask(char **ptr,char *end,quint32 maskval)

{
  long lVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 in_EDX;
  ulong in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  ushort uVar5;
  ulong uVar6;
  ulong uVar7;
  quint8 result_1;
  __m128i comparison_1;
  __m128i masked_1;
  __m128i data_1;
  quint16 result;
  __m128i comparison;
  __m128i masked;
  __m128i data;
  __m128i mask;
  anon_class_8_1_ba1d6e4e updatePtr;
  uint in_stack_fffffffffffffe2c;
  undefined6 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  undefined8 local_1c8;
  undefined8 local_188;
  undefined8 uStack_180;
  bool local_125;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  while (*in_RDI + 0x10U <= in_RSI) {
    uVar6 = CONCAT44(in_EDX,in_EDX) & *(ulong *)*in_RDI;
    uVar7 = CONCAT44(in_EDX,in_EDX) & ((ulong *)*in_RDI)[1];
    local_88 = (short)uVar6;
    sStack_86 = (short)(uVar6 >> 0x10);
    sStack_84 = (short)(uVar6 >> 0x20);
    sStack_82 = (short)(uVar6 >> 0x30);
    sStack_80 = (short)uVar7;
    sStack_7e = (short)(uVar7 >> 0x10);
    sStack_7c = (short)(uVar7 >> 0x20);
    sStack_7a = (short)(uVar7 >> 0x30);
    uVar5 = -(ushort)(sStack_7a == 0);
    local_188 = CONCAT26(-(ushort)(sStack_82 == 0),
                         CONCAT24(-(ushort)(sStack_84 == 0),
                                  CONCAT22(-(ushort)(sStack_86 == 0),-(ushort)(local_88 == 0))));
    uStack_180 = CONCAT26(uVar5,CONCAT24(-(ushort)(sStack_7c == 0),
                                         CONCAT22(-(ushort)(sStack_7e == 0),
                                                  -(ushort)(sStack_80 == 0))));
    auVar4._8_8_ = uStack_180;
    auVar4._0_8_ = local_188;
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)((byte)(uStack_180 >> 7) & 1) << 8 |
                 (ushort)((byte)(uStack_180 >> 0xf) & 1) << 9 |
                 (ushort)((byte)(uStack_180 >> 0x17) & 1) << 10 |
                 (ushort)((byte)(uStack_180 >> 0x1f) & 1) << 0xb |
                 (ushort)((byte)(uStack_180 >> 0x27) & 1) << 0xc |
                 (ushort)((byte)(uStack_180 >> 0x2f) & 1) << 0xd |
                 (ushort)((byte)(uVar5 >> 7) & 1) << 0xe | uVar5 & 0x8000) != 0xffff) {
      local_125 = simdTestMask::anon_class_8_1_ba1d6e4e::operator()
                            ((anon_class_8_1_ba1d6e4e *)
                             CONCAT17(in_stack_fffffffffffffe37,
                                      CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30))
                             ,in_stack_fffffffffffffe2c);
      goto LAB_00504890;
    }
    *in_RDI = *in_RDI + 0x10;
  }
  if (*in_RDI + 8U <= in_RSI) {
    uVar6 = CONCAT44(in_EDX,in_EDX) & *(ulong *)*in_RDI;
    local_a8 = (short)uVar6;
    sStack_a6 = (short)(uVar6 >> 0x10);
    sStack_a4 = (short)(uVar6 >> 0x20);
    sStack_a2 = (short)(uVar6 >> 0x30);
    local_1c8 = CONCAT26(-(ushort)(sStack_a2 == 0),
                         CONCAT24(-(ushort)(sStack_a4 == 0),
                                  CONCAT22(-(ushort)(sStack_a6 == 0),-(ushort)(local_a8 == 0))));
    auVar3._8_8_ = 0xffffffffffffffff;
    auVar3._0_8_ = local_1c8;
    bVar2 = SUB161(auVar3 >> 7,0) & 1 | (SUB161(auVar3 >> 0xf,0) & 1) << 1 |
            (SUB161(auVar3 >> 0x17,0) & 1) << 2 | (SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
            (SUB161(auVar3 >> 0x27,0) & 1) << 4 | (SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
            (SUB161(auVar3 >> 0x37,0) & 1) << 6 | SUB161(auVar3 >> 0x3f,0) << 7;
    if (bVar2 != 0xff) {
      local_125 = simdTestMask::anon_class_8_1_ba1d6e4e::operator()
                            ((anon_class_8_1_ba1d6e4e *)
                             CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffe36,
                                                     in_stack_fffffffffffffe30)),
                             in_stack_fffffffffffffe2c);
      goto LAB_00504890;
    }
    *in_RDI = *in_RDI + 8;
  }
  local_125 = true;
LAB_00504890:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_125;
  }
  __stack_chk_fail();
}

Assistant:

static bool simdTestMask(const char *&ptr, const char *end, quint32 maskval)
{
    auto updatePtr = [&](uint result) {
        // found a character matching the mask
        uint idx = qCountTrailingZeroBits(~result);
        ptr += idx;
        return false;
    };

    if constexpr (UseSse4_1) {
#  ifndef Q_OS_QNX              // compiler fails in the code below
        __m128i mask;
        auto updatePtrSimd = [&](__m128i data) -> bool {
            __m128i masked = _mm_and_si128(mask, data);
            __m128i comparison = _mm_cmpeq_epi16(masked, _mm_setzero_si128());
            uint result = _mm_movemask_epi8(comparison);
            return updatePtr(result);
        };

        if constexpr (UseAvx2) {
            // AVX2 implementation: test 32 bytes at a time
            const __m256i mask256 = _mm256_broadcastd_epi32(_mm_cvtsi32_si128(maskval));
            while (ptr + 32 <= end) {
                __m256i data = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(ptr));
                if (!_mm256_testz_si256(mask256, data)) {
                    // found a character matching the mask
                    __m256i masked256 = _mm256_and_si256(mask256, data);
                    __m256i comparison256 = _mm256_cmpeq_epi16(masked256, _mm256_setzero_si256());
                    return updatePtr(_mm256_movemask_epi8(comparison256));
                }
                ptr += 32;
            }

            mask = _mm256_castsi256_si128(mask256);
        } else {
            // SSE 4.1 implementation: test 32 bytes at a time (two 16-byte
            // comparisons, unrolled)
            mask = _mm_set1_epi32(maskval);
            while (ptr + 32 <= end) {
                __m128i data1 = _mm_loadu_si128(reinterpret_cast<const __m128i *>(ptr));
                __m128i data2 = _mm_loadu_si128(reinterpret_cast<const __m128i *>(ptr + 16));
                if (!_mm_testz_si128(mask, data1))
                    return updatePtrSimd(data1);

                ptr += 16;
                if (!_mm_testz_si128(mask, data2))
                    return updatePtrSimd(data2);
                ptr += 16;
            }
        }

        // AVX2 and SSE4.1: final 16-byte comparison
        if (ptr + 16 <= end) {
            __m128i data1 = _mm_loadu_si128(reinterpret_cast<const __m128i *>(ptr));
            if (!_mm_testz_si128(mask, data1))
                return updatePtrSimd(data1);
            ptr += 16;
        }

        // and final 8-byte comparison
        if (ptr + 8 <= end) {
            __m128i data1 = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(ptr));
            if (!_mm_testz_si128(mask, data1))
                return updatePtrSimd(data1);
            ptr += 8;
        }

        return true;
#  endif // QNX
    }

    // SSE2 implementation: test 16 bytes at a time.
    const __m128i mask = _mm_set1_epi32(maskval);
    while (ptr + 16 <= end) {
        __m128i data = _mm_loadu_si128(reinterpret_cast<const __m128i *>(ptr));
        __m128i masked = _mm_and_si128(mask, data);
        __m128i comparison = _mm_cmpeq_epi16(masked, _mm_setzero_si128());
        quint16 result = _mm_movemask_epi8(comparison);
        if (result != 0xffff)
            return updatePtr(result);
        ptr += 16;
    }

    // and one 8-byte comparison
    if (ptr + 8 <= end) {
        __m128i data = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(ptr));
        __m128i masked = _mm_and_si128(mask, data);
        __m128i comparison = _mm_cmpeq_epi16(masked, _mm_setzero_si128());
        quint8 result = _mm_movemask_epi8(comparison);
        if (result != 0xff)
            return updatePtr(result);
        ptr += 8;
    }

    return true;
}